

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O2

bool QtGuiTest::synthesizeKeyEvent
               (QWindow *window,Type t,int k,KeyboardModifiers mods,QString *text,bool autorep,
               ushort count)

{
  bool bVar1;
  QDebug *pQVar2;
  char *t_00;
  long in_FS_OFFSET;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_60,"Synthesizing key event:");
    local_58.stream = pQVar2->stream;
    (local_58.stream)->ref = (local_58.stream)->ref + 1;
    ::operator<<((Stream *)&local_50,(Type)&local_58);
    ::operator<<((Stream *)&local_48,(Key)&local_50);
    operator<<<QFlags<Qt::KeyboardModifier>,_true>
              ((Stream *)&local_40,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(&local_48,0))
    ;
    QDebug::operator<<(&local_40,text);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
  }
  bVar1 = QWindowSystemInterface::handleKeyEvent<QWindowSystemInterface::DefaultDelivery>
                    (window,t,k,mods,text,autorep,count);
  if (bVar1) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_002ee5a8;
    QMessageLogger::debug();
    t_00 = "(success)";
  }
  else {
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_002ee5a8;
    QMessageLogger::debug();
    t_00 = "(failure)";
  }
  QDebug::operator<<(&local_40,t_00);
  QDebug::~QDebug(&local_40);
LAB_002ee5a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QtGuiTest::synthesizeKeyEvent(QWindow *window, QEvent::Type t, int k, Qt::KeyboardModifiers mods,
                                          const QString & text, bool autorep,
                                          ushort count)
{
    Q_ASSERT_X((t == QEvent::KeyPress
                || t == QEvent::KeyRelease),
               Q_FUNC_INFO,
               "called with invalid QEvent type");

    deb << "Synthesizing key event:" << t << Qt::Key(k) << mods << text;

    bool result = QWindowSystemInterface::handleKeyEvent(window, t, k, mods, text, autorep, count);
    if (result) {
        // If the key event is a shortcut, it may cause other events to be posted.
        // => process those.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }

    return result;
}